

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O2

void __thiscall
ContractHashUtil_GetContractScript2of2_Test::~ContractHashUtil_GetContractScript2of2_Test
          (ContractHashUtil_GetContractScript2of2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScript2of2) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  // 2-of-2 multisig
  Script fedpeg_script("5221032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db21030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a14352ae");
  Script script;
  EXPECT_NO_THROW(
      (script = ContractHashUtil::GetContractScript(claim_script,
          fedpeg_script)));
  EXPECT_STREQ(
      script.GetHex().c_str(),
      "522102aaf888b7e9fe586491887f65afd4d9c08f2791a74e6d60d3ebdac3d359cc26392102710f06a4fcdb7341b6410524dd920759d7d467ee76f525e586892f9ab63deff652ae");
}